

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (serializer<toml::type_config> *this,integer_type i,integer_format_info *fmt,
          source_location *loc)

{
  char cVar1;
  bool bVar2;
  _Setfill<char> _Var3;
  ostream *poVar4;
  void *pvVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  reference pcVar7;
  char *__lhs;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  string_type *in_RDI;
  reverse_iterator iter;
  size_t bits;
  string tmp;
  integer_type x;
  string retval;
  anon_class_8_1_ba1d47ed insert_spacer;
  ostringstream oss;
  undefined7 in_stack_fffffffffffff848;
  char in_stack_fffffffffffff84f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff858;
  source_location *in_stack_fffffffffffff860;
  source_location *in_stack_fffffffffffff868;
  serialization_error *in_stack_fffffffffffff870;
  undefined7 in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff887;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff898;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a7;
  string *in_stack_fffffffffffff940;
  anon_class_8_1_ba1d47ed *in_stack_fffffffffffff948;
  string *in_stack_fffffffffffff9d8;
  source_location *in_stack_fffffffffffff9e0;
  undefined7 in_stack_fffffffffffff9e8;
  integer_format in_stack_fffffffffffff9ef;
  allocator<char> local_531 [81];
  ulong local_4e0;
  long local_4b8;
  allocator<char> local_469 [68];
  char local_425;
  int local_424;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d9 [2];
  char local_391;
  int local_390;
  undefined1 local_389;
  int local_1e4;
  char *local_1c0;
  locale local_1a8 [8];
  ostringstream local_1a0 [384];
  char *local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  set_locale((serializer<toml::type_config> *)in_stack_fffffffffffff868,
             (ostream *)in_stack_fffffffffffff860);
  std::locale::~locale(local_1a8);
  local_1c0 = local_20;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff860);
  if (*local_20 == '\0') {
    local_1e4 = (int)CLI::std::setw(*(int *)(local_20 + 8));
    poVar4 = std::operator<<((ostream *)local_1a0,(_Setw)local_1e4);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::dec);
    std::ostream::operator<<(pvVar5,local_18);
    std::__cxx11::ostringstream::str();
    operator()::anon_class_8_1_ba1d47ed::operator()
              (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff898);
    std::__cxx11::string::~string(in_stack_fffffffffffff850);
    std::__cxx11::string::~string(in_stack_fffffffffffff850);
    if (((*(byte *)(in_RSI + 0x14) & 1) != 0) &&
       (bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x70a563), !bVar2)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffff850,in_stack_fffffffffffff84f);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator+=(in_stack_fffffffffffff850,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    }
  }
  else {
    if (local_18 < 0) {
      local_389 = 1;
      uVar6 = __cxa_allocate_exception(0xa0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
      source_location::source_location
                ((source_location *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
      format_error<>((string *)CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8),
                     in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
      source_location::source_location
                ((source_location *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      serialization_error::serialization_error
                (in_stack_fffffffffffff870,(string *)in_stack_fffffffffffff868,
                 in_stack_fffffffffffff860);
      local_389 = 0;
      __cxa_throw(uVar6,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    cVar1 = *local_20;
    if (cVar1 == '\x01') {
      local_4b8 = local_18;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff860);
      local_4e0 = 0;
      for (; local_4b8 != 0; local_4b8 = local_4b8 >> 1) {
        if (((*(long *)(local_20 + 0x10) != 0) && (local_4e0 != 0)) &&
           (local_4e0 % *(ulong *)(local_20 + 0x10) == 0)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffff850,in_stack_fffffffffffff84f);
        }
        if (local_4b8 % 2 == 1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffff850,in_stack_fffffffffffff84f);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffff850,in_stack_fffffffffffff84f);
        }
        local_4e0 = local_4e0 + 1;
      }
      for (; local_4e0 < *(ulong *)(local_20 + 8); local_4e0 = local_4e0 + 1) {
        if (((*(long *)(local_20 + 0x10) != 0) && (local_4e0 != 0)) &&
           (local_4e0 % *(ulong *)(local_20 + 0x10) == 0)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_fffffffffffff850,in_stack_fffffffffffff84f);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=(in_stack_fffffffffffff850,in_stack_fffffffffffff84f);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
                (in_stack_fffffffffffff858);
      while( true ) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
                  (in_stack_fffffffffffff858);
        bVar2 = std::
                operator==<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff860,
                           (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff858);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        pcVar7 = CLI::std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff850);
        std::operator<<((ostream *)local_1a0,*pcVar7);
        CLI::std::
        reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff850);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
      std::__cxx11::ostringstream::str();
      std::operator+(in_stack_fffffffffffff888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                in_stack_fffffffffffff898);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::allocator<char>::~allocator(local_531);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
    }
    else if (cVar1 == '\x02') {
      local_424 = (int)CLI::std::setw(*(int *)(local_20 + 8));
      in_stack_fffffffffffff888 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)local_1a0,(_Setw)local_424);
      _Var3 = std::setfill<char>('0');
      local_425 = _Var3._M_c;
      poVar4 = std::operator<<(in_stack_fffffffffffff888,_Var3._M_c);
      pvVar5 = (void *)std::ostream::operator<<(poVar4,CLI::std::oct);
      std::ostream::operator<<(pvVar5,local_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                 (allocator<char> *)CONCAT17(_Var3._M_c,in_stack_fffffffffffff880));
      std::__cxx11::ostringstream::str();
      operator()::anon_class_8_1_ba1d47ed::operator()
                (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::operator+(in_stack_fffffffffffff888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(_Var3._M_c,in_stack_fffffffffffff880));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                in_stack_fffffffffffff898);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::allocator<char>::~allocator(local_469);
    }
    else {
      if (cVar1 != '\x03') {
        __lhs = (char *)__cxa_allocate_exception(0xa0);
        to_string_abi_cxx11_(in_stack_fffffffffffff9ef);
        std::operator+(__lhs,in_stack_fffffffffffff850);
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880))
        ;
        format_error<>((string *)CONCAT17(in_stack_fffffffffffff9ef,in_stack_fffffffffffff9e8),
                       in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        source_location::source_location
                  ((source_location *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
        serialization_error::serialization_error
                  (in_stack_fffffffffffff870,(string *)in_stack_fffffffffffff868,
                   in_stack_fffffffffffff860);
        __cxa_throw(__lhs,&serialization_error::typeinfo,serialization_error::~serialization_error);
      }
      poVar4 = (ostream *)std::ostream::operator<<(local_1a0,std::noshowbase);
      local_390 = (int)CLI::std::setw(*(int *)(local_20 + 8));
      poVar4 = std::operator<<(poVar4,(_Setw)local_390);
      _Var3 = std::setfill<char>('0');
      local_391 = _Var3._M_c;
      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::operator<<(poVar4,_Var3._M_c);
      std::ostream::operator<<(__str,CLI::std::hex);
      if ((local_20[1] & 1U) == 0) {
        std::ostream::operator<<(local_1a0,std::nouppercase);
      }
      else {
        std::ostream::operator<<(local_1a0,std::uppercase);
      }
      std::ostream::operator<<(local_1a0,local_18);
      in_stack_fffffffffffff890 = local_3d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
      std::__cxx11::ostringstream::str();
      operator()::anon_class_8_1_ba1d47ed::operator()
                (in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      std::operator+(in_stack_fffffffffffff888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(_Var3._M_c,in_stack_fffffffffffff8a0),__str);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::__cxx11::string::~string(in_stack_fffffffffffff850);
      std::allocator<char>::~allocator((allocator<char> *)local_3d9);
    }
  }
  std::__cxx11::string::string(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff888);
  std::__cxx11::string::~string(in_stack_fffffffffffff850);
  std::__cxx11::string::~string(in_stack_fffffffffffff850);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

string_type operator()(const integer_type i, const integer_format_info& fmt, const source_location& loc) // {{{
    {
        std::ostringstream oss;
        this->set_locale(oss);

        const auto insert_spacer = [&fmt](std::string s) -> std::string {
            if(fmt.spacer == 0) {return s;}

            std::string sign;
            if( ! s.empty() && (s.at(0) == '+' || s.at(0) == '-'))
            {
                sign += s.at(0);
                s.erase(s.begin());
            }

            std::string spaced;
            std::size_t counter = 0;
            for(auto iter = s.rbegin(); iter != s.rend(); ++iter)
            {
                if(counter != 0 && counter % fmt.spacer == 0)
                {
                    spaced += '_';
                }
                spaced += *iter;
                counter += 1;
            }
            if(!spaced.empty() && spaced.back() == '_') {spaced.pop_back();}

            s.clear();
            std::copy(spaced.rbegin(), spaced.rend(), std::back_inserter(s));
            return sign + s;
        };

        std::string retval;
        if(fmt.fmt == integer_format::dec)
        {
            oss << std::setw(static_cast<int>(fmt.width)) << std::dec << i;
            retval = insert_spacer(oss.str());

            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                retval += '_';
                retval += fmt.suffix;
            }
        }
        else
        {
            if(i < 0)
            {
                throw serialization_error(format_error("binary, octal, hexadecimal "
                    "integer does not allow negative value", loc, "here"), loc);
            }
            switch(fmt.fmt)
            {
                case integer_format::hex:
                {
                    oss << std::noshowbase
                        << std::setw(static_cast<int>(fmt.width))
                        << std::setfill('0')
                        << std::hex;
                    if(fmt.uppercase)
                    {
                        oss << std::uppercase;
                    }
                    else
                    {
                        oss << std::nouppercase;
                    }
                    oss << i;
                    retval = std::string("0x") + insert_spacer(oss.str());
                    break;
                }
                case integer_format::oct:
                {
                    oss << std::setw(static_cast<int>(fmt.width)) << std::setfill('0') << std::oct << i;
                    retval = std::string("0o") + insert_spacer(oss.str());
                    break;
                }
                case integer_format::bin:
                {
                    integer_type x{i};
                    std::string tmp;
                    std::size_t bits(0);
                    while(x != 0)
                    {
                        if(fmt.spacer != 0)
                        {
                            if(bits != 0 && (bits % fmt.spacer) == 0) {tmp += '_';}
                        }
                        if(x % 2 == 1) { tmp += '1'; } else { tmp += '0'; }
                        x >>= 1;
                        bits += 1;
                    }
                    for(; bits < fmt.width; ++bits)
                    {
                        if(fmt.spacer != 0)
                        {
                            if(bits != 0 && (bits % fmt.spacer) == 0) {tmp += '_';}
                        }
                        tmp += '0';
                    }
                    for(auto iter = tmp.rbegin(); iter != tmp.rend(); ++iter)
                    {
                        oss << *iter;
                    }
                    retval = std::string("0b") + oss.str();
                    break;
                }
                default:
                {
                    throw serialization_error(format_error(
                        "none of dec, hex, oct, bin: " + to_string(fmt.fmt),
                        loc, "here"), loc);
                }
            }
        }
        return string_conv<string_type>(retval);
    }